

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_handle.cpp
# Opt level: O2

SysCallInt32Result cppnet::OsHandle::Listen(int64_t sockfd,uint32_t len)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  
  if (len == 0) {
    len = 0x1000;
  }
  uVar1 = listen((int)sockfd,len);
  if ((int)uVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    uVar3 = (ulong)*puVar2 << 0x20;
  }
  else {
    uVar3 = 0;
  }
  return (SysCallInt32Result)(uVar1 | uVar3);
}

Assistant:

SysCallInt32Result OsHandle::Listen(int64_t sockfd, uint32_t len) {
    if (len == 0) {
        len = SOMAXCONN;
    }
    
    int32_t ret = listen(sockfd, len);
    if (ret < 0) {
        return {ret, errno};
    }
    return {ret, 0};
}